

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AttributeInstanceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AttributeInstanceSyntax,slang::syntax::AttributeInstanceSyntax_const&>
          (BumpAllocator *this,AttributeInstanceSyntax *args)

{
  AttributeInstanceSyntax *pAVar1;
  AttributeInstanceSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pAVar1 = (AttributeInstanceSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::AttributeInstanceSyntax::AttributeInstanceSyntax(in_RSI,pAVar1);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }